

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

int stbi__tga_test(stbi__context *s)

{
  byte *pbVar1;
  byte bVar2;
  stbi_uc *psVar3;
  stbi_uc *psVar4;
  ulong uVar5;
  int iVar6;
  stbi_uc *psVar7;
  uint uVar8;
  uint uVar9;
  void *pvVar10;
  byte bVar11;
  
  psVar3 = s->img_buffer;
  psVar7 = s->img_buffer_end;
  if (psVar3 < psVar7) {
LAB_001111b4:
    psVar3 = psVar3 + 1;
    s->img_buffer = psVar3;
  }
  else if (s->read_from_callbacks != 0) {
    iVar6 = (*(s->io).read)(s->io_user_data,(char *)s->buffer_start,s->buflen);
    if (iVar6 == 0) {
      s->read_from_callbacks = 0;
      psVar7 = s->buffer_start + 1;
      s->buffer_start[0] = '\0';
    }
    else {
      psVar7 = s->buffer_start + iVar6;
    }
    s->img_buffer_end = psVar7;
    psVar3 = s->buffer_start;
    goto LAB_001111b4;
  }
  if (psVar3 < psVar7) {
    psVar4 = psVar3 + 1;
    s->img_buffer = psVar4;
    bVar11 = *psVar3;
LAB_00111222:
    psVar3 = psVar4;
    if (bVar11 < 2) goto LAB_0011122c;
LAB_00111302:
    uVar9 = 0;
  }
  else {
    if (s->read_from_callbacks != 0) {
      psVar3 = s->buffer_start;
      iVar6 = (*(s->io).read)(s->io_user_data,(char *)psVar3,s->buflen);
      if (iVar6 == 0) {
        s->read_from_callbacks = 0;
        psVar7 = s->buffer_start + 1;
        s->buffer_start[0] = '\0';
        bVar11 = 0;
      }
      else {
        psVar7 = psVar3 + iVar6;
        bVar11 = *psVar3;
      }
      s->img_buffer_end = psVar7;
      psVar4 = s->buffer_start + 1;
      s->img_buffer = psVar4;
      goto LAB_00111222;
    }
    bVar11 = 0;
LAB_0011122c:
    if (psVar3 < psVar7) {
      s->img_buffer = psVar3 + 1;
      bVar2 = *psVar3;
      psVar3 = psVar3 + 1;
    }
    else if (s->read_from_callbacks == 0) {
      bVar2 = 0;
    }
    else {
      psVar3 = s->buffer_start;
      iVar6 = (*(s->io).read)(s->io_user_data,(char *)psVar3,s->buflen);
      if (iVar6 == 0) {
        s->read_from_callbacks = 0;
        psVar7 = s->buffer_start + 1;
        s->buffer_start[0] = '\0';
        bVar2 = 0;
      }
      else {
        psVar7 = psVar3 + iVar6;
        bVar2 = *psVar3;
      }
      s->img_buffer_end = psVar7;
      psVar3 = s->buffer_start + 1;
    }
    if (bVar11 == 0) {
      if ((bVar2 & 0xf6) != 2) goto LAB_00111302;
      if (((s->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) ||
         (iVar6 = (int)psVar7 - (int)psVar3, 8 < iVar6)) {
        s->img_buffer = psVar3 + 9;
      }
      else {
        s->img_buffer = psVar7;
        pvVar10 = s->io_user_data;
        iVar6 = 9 - iVar6;
LAB_001113cd:
        (*(s->io).skip)(pvVar10,iVar6);
      }
    }
    else {
      uVar8 = 0;
      uVar9 = uVar8;
      if ((bVar2 & 0xf7) != 1) goto LAB_00111304;
      if (((s->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) ||
         (iVar6 = (int)psVar7 - (int)psVar3, 3 < iVar6)) {
        psVar3 = psVar3 + 4;
        s->img_buffer = psVar3;
      }
      else {
        s->img_buffer = psVar7;
        (*(s->io).skip)(s->io_user_data,4 - iVar6);
        psVar3 = s->img_buffer;
        psVar7 = s->img_buffer_end;
      }
      if (psVar3 < psVar7) {
        psVar4 = psVar3 + 1;
        s->img_buffer = psVar4;
        bVar2 = *psVar3;
      }
      else {
        uVar9 = 0;
        if (s->read_from_callbacks == 0) goto LAB_00111304;
        psVar3 = s->buffer_start;
        iVar6 = (*(s->io).read)(s->io_user_data,(char *)psVar3,s->buflen);
        if (iVar6 == 0) {
          s->read_from_callbacks = 0;
          psVar7 = s->buffer_start + 1;
          s->buffer_start[0] = '\0';
          bVar2 = 0;
        }
        else {
          psVar7 = psVar3 + iVar6;
          bVar2 = *psVar3;
        }
        s->img_buffer_end = psVar7;
        psVar4 = s->buffer_start + 1;
      }
      uVar9 = uVar8;
      if ((0x20 < bVar2) || ((0x101018100U >> ((ulong)bVar2 & 0x3f) & 1) == 0)) goto LAB_00111304;
      if (((s->io).read != (_func_int_void_ptr_char_ptr_int *)0x0) &&
         (iVar6 = (int)psVar7 - (int)psVar4, iVar6 < 4)) {
        s->img_buffer = psVar7;
        pvVar10 = s->io_user_data;
        iVar6 = 4 - iVar6;
        goto LAB_001113cd;
      }
      s->img_buffer = psVar4 + 4;
    }
    iVar6 = stbi__get16le(s);
    uVar9 = 0;
    if ((iVar6 != 0) && (iVar6 = stbi__get16le(s), iVar6 != 0)) {
      pbVar1 = s->img_buffer;
      if (pbVar1 < s->img_buffer_end) {
        s->img_buffer = pbVar1 + 1;
        uVar5 = (ulong)*pbVar1;
      }
      else if (s->read_from_callbacks == 0) {
        uVar5 = 0;
      }
      else {
        psVar3 = s->buffer_start;
        iVar6 = (*(s->io).read)(s->io_user_data,(char *)psVar3,s->buflen);
        if (iVar6 == 0) {
          s->read_from_callbacks = 0;
          psVar7 = s->buffer_start + 1;
          s->buffer_start[0] = '\0';
          uVar5 = 0;
        }
        else {
          psVar7 = psVar3 + iVar6;
          uVar5 = (ulong)*psVar3;
        }
        s->img_buffer_end = psVar7;
        s->img_buffer = s->buffer_start + 1;
      }
      if (bVar11 == 0) {
        if (((byte)uVar5 < 0x21) && ((0x101018100U >> (uVar5 & 0x3f) & 1) != 0)) {
          uVar9 = 1;
        }
      }
      else {
        uVar9 = (uint)(((byte)uVar5 - 8 & 0xf7) == 0);
      }
    }
  }
LAB_00111304:
  s->img_buffer = s->img_buffer_original;
  s->img_buffer_end = s->img_buffer_original_end;
  return uVar9;
}

Assistant:

static int stbi__tga_test(stbi__context *s)
{
   int res = 0;
   int sz, tga_color_type;
   stbi__get8(s);      //   discard Offset
   tga_color_type = stbi__get8(s);   //   color type
   if ( tga_color_type > 1 ) goto errorEnd;   //   only RGB or indexed allowed
   sz = stbi__get8(s);   //   image type
   if ( tga_color_type == 1 ) { // colormapped (paletted) image
      if (sz != 1 && sz != 9) goto errorEnd; // colortype 1 demands image type 1 or 9
      stbi__skip(s,4);       // skip index of first colormap entry and number of entries
      sz = stbi__get8(s);    //   check bits per palette color entry
      if ( (sz != 8) && (sz != 15) && (sz != 16) && (sz != 24) && (sz != 32) ) goto errorEnd;
      stbi__skip(s,4);       // skip image x and y origin
   } else { // "normal" image w/o colormap
      if ( (sz != 2) && (sz != 3) && (sz != 10) && (sz != 11) ) goto errorEnd; // only RGB or grey allowed, +/- RLE
      stbi__skip(s,9); // skip colormap specification and image x/y origin
   }
   if ( stbi__get16le(s) < 1 ) goto errorEnd;      //   test width
   if ( stbi__get16le(s) < 1 ) goto errorEnd;      //   test height
   sz = stbi__get8(s);   //   bits per pixel
   if ( (tga_color_type == 1) && (sz != 8) && (sz != 16) ) goto errorEnd; // for colormapped images, bpp is size of an index
   if ( (sz != 8) && (sz != 15) && (sz != 16) && (sz != 24) && (sz != 32) ) goto errorEnd;

   res = 1; // if we got this far, everything's good and we can return 1 instead of 0

errorEnd:
   stbi__rewind(s);
   return res;
}